

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexCfg(void)

{
  bool bVar1;
  bool local_1c [4];
  int local_18;
  bool optionals [4];
  aint cfgArgs [4];
  
  if (nex.f == (FILE *)0x0) {
    Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
  }
  else {
    memset(&local_18,0,0x10);
    local_1c[0] = false;
    local_1c[1] = true;
    local_1c[2] = true;
    local_1c[3] = true;
    bVar1 = getIntArguments<4>(&lp,(aint (*) [4])&local_18,&local_1c);
    if (bVar1) {
      if (((((local_18 < 0) || (7 < local_18)) || ((int)optionals < 0)) ||
          ((0xfffe < (int)optionals || (cfgArgs[0] < 0)))) ||
         ((1 < cfgArgs[0] || ((cfgArgs[1] < 0 || (1 < cfgArgs[1])))))) {
        Warning("[SAVENEX] values are not within 0..7,0..65534,0/1,0/1 ranges",(char *)0x0,W_PASS3);
      }
      nex.h.border = (byte)local_18 & 7;
      nex.h.fileHandleCfg = optionals._0_2_;
      nex.h.preserveNextRegs = (byte)cfgArgs[0];
      nex.h.ramReq = (byte)cfgArgs[1];
    }
    else {
      Error("[SAVENEX] expected syntax is CFG <border 0..7>[,<fileHandle 0/1/$4000+>[,<PreserveNextRegs 0/1>[,<2MbRamReq 0/1>]]]"
            ,bp,SUPPRESS);
    }
  }
  return;
}

Assistant:

static void dirNexCfg() {
// ;; SAVENEX CFG <border 0..7>[,<fileHandle 0/1/$4000+>[,<PreserveNextRegs 0/1>[,<2MbRamReq 0/1>]]]
	if (nullptr == nex.f) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	// parse arguments
	aint cfgArgs[4] = {0};
	const bool optionals[] = {false, true, true, true};
	if (!getIntArguments<4>(lp, cfgArgs, optionals)) {
		Error("[SAVENEX] expected syntax is CFG <border 0..7>[,<fileHandle 0/1/$4000+>[,<PreserveNextRegs 0/1>[,<2MbRamReq 0/1>]]]", bp, SUPPRESS);
		return;
	}
	// warn about invalid values
	if (cfgArgs[0] < 0 || 7 < cfgArgs[0] ||
		cfgArgs[1] < 0 || 0xFFFE < cfgArgs[1] ||
		cfgArgs[2] < 0 || 1 < cfgArgs[2] ||
		cfgArgs[3] < 0 || 1 < cfgArgs[3]) Warning("[SAVENEX] values are not within 0..7,0..65534,0/1,0/1 ranges");
	// set the values in header
	nex.h.border = cfgArgs[0] & 7;
	nex.h.fileHandleCfg = cfgArgs[1];
	nex.h.preserveNextRegs = cfgArgs[2];
	nex.h.ramReq = cfgArgs[3];
}